

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

bool __thiscall Debugger::GetStacks(Debugger *this,vector<Stack,_std::allocator<Stack>_> *stacks)

{
  lua_State *plVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Variable *pVVar6;
  lua_State *L;
  int iVar7;
  int i_1;
  int iVar8;
  int i;
  Idx<Variable> IVar9;
  Idx<Variable> variable;
  Idx<Variable> var;
  lua_Debug ar;
  
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    iVar8 = 0;
    L = plVar1;
    do {
      iVar7 = 0;
      while( true ) {
        memset(&ar,0,0x450);
        iVar3 = (*lua_getstack)(L,iVar7,&ar);
        if (iVar3 == 0) break;
        iVar3 = (*lua_getinfo)(L,"nSlu",&ar);
        if (iVar3 != 0) {
          std::vector<Stack,_std::allocator<Stack>_>::emplace_back<>(stacks);
          pSVar2 = (stacks->super__Vector_base<Stack,_std::allocator<Stack>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          GetFile_abi_cxx11_((string *)&var,this,&ar);
          std::__cxx11::string::operator=((string *)&pSVar2[-1].file,(string *)&var);
          std::__cxx11::string::~string((string *)&var);
          pcVar5 = getDebugName(&ar);
          if (pcVar5 != (char *)0x0) {
            getDebugName(&ar);
          }
          std::__cxx11::string::assign((char *)&pSVar2[-1].functionName);
          pSVar2[-1].level = iVar8;
          iVar3 = getDebugCurrentLine(&ar);
          pSVar2[-1].line = iVar3;
          iVar3 = 1;
          while( true ) {
            pcVar5 = (*lua_getlocal)(L,&ar,iVar3);
            if (pcVar5 == (char *)0x0) break;
            if (*pcVar5 == '(') {
              (*lua_settop)(L,-2);
            }
            else {
              IVar9 = Arena<Variable>::Alloc
                                (pSVar2[-1].variableArena.
                                 super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
              var._arena = IVar9._arena;
              var.Raw = IVar9.Raw;
              pVVar6 = Idx<Variable>::operator->(&var);
              std::__cxx11::string::assign((char *)&pVVar6->name);
              this->arenaRef =
                   pSVar2[-1].variableArena.
                   super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              variable._4_4_ = 0;
              variable.Raw = var.Raw;
              variable._arena = var._arena;
              GetVariable(this,L,variable,-1,1,true);
              this->arenaRef = (Arena<Variable> *)0x0;
              (*lua_settop)(L,-2);
              std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                        (&pSVar2[-1].localVariables,&var);
            }
            iVar3 = iVar3 + 1;
          }
          iVar3 = (*lua_getinfo)(L,"f",&ar);
          if (iVar3 != 0) {
            iVar4 = (*lua_gettop)(L);
            iVar3 = 1;
            while( true ) {
              pcVar5 = (*lua_getupvalue)(L,iVar4,iVar3);
              if (pcVar5 == (char *)0x0) break;
              IVar9 = Arena<Variable>::Alloc
                                (pSVar2[-1].variableArena.
                                 super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
              var._arena = IVar9._arena;
              var.Raw = IVar9.Raw;
              pVVar6 = Idx<Variable>::operator->(&var);
              std::__cxx11::string::assign((char *)&pVVar6->name);
              this->arenaRef =
                   pSVar2[-1].variableArena.
                   super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              IVar9._4_4_ = 0;
              IVar9.Raw = var.Raw;
              IVar9._arena = var._arena;
              GetVariable(this,L,IVar9,-1,1,true);
              this->arenaRef = (Arena<Variable> *)0x0;
              (*lua_settop)(L,-2);
              std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                        (&pSVar2[-1].upvalueVariables,&var);
              iVar3 = iVar3 + 1;
            }
            (*lua_settop)(L,-2);
          }
          iVar8 = iVar8 + 1;
          iVar7 = iVar7 + 1;
        }
      }
      L = ExtensionPoint::QueryParentThread(&this->manager->extension,L);
    } while (L != (lua_State *)0x0);
    this->currentL = plVar1;
  }
  return false;
}

Assistant:

bool Debugger::GetStacks(std::vector<Stack> &stacks) {
	if (!currentL) {
		return false;
	}

	auto prevCurrentL = currentL;
	auto L = currentL;

	int totalLevel = 0;
	while (true) {
		int level = 0;
		while (true) {
			lua_Debug ar{};
			if (!lua_getstack(L, level, &ar)) {
				break;
			}
			if (!lua_getinfo(L, "nSlu", &ar)) {
				continue;
			}
			// C++ 17 only return T&
			stacks.emplace_back();
			auto &stack = stacks.back();
			stack.file = GetFile(&ar);
			stack.functionName = getDebugName(&ar) == nullptr ? "" : getDebugName(&ar);
			stack.level = totalLevel++;
			stack.line = getDebugCurrentLine(&ar);

			// get variables
			{
				for (int i = 1;; i++) {
					const char *name = lua_getlocal(L, &ar, i);
					if (name == nullptr) {
						break;
					}
					if (name[0] == '(') {
						lua_pop(L, 1);
						continue;
					}

					// add local variable
					auto var = stack.variableArena->Alloc();
					var->name = name;
					SetVariableArena(stack.variableArena.get());
					GetVariable(L, var, -1, 1);
					ClearVariableArenaRef();
					lua_pop(L, 1);
					stack.localVariables.push_back(var);
				}

				if (lua_getinfo(L, "f", &ar)) {
					const int fIdx = lua_gettop(L);
					for (int i = 1;; i++) {
						const char *name = lua_getupvalue(L, fIdx, i);
						if (!name) {
							break;
						}

						// add up variable
						auto var = stack.variableArena->Alloc();
						var->name = name;
						SetVariableArena(stack.variableArena.get());
						GetVariable(L, var, -1, 1);
						ClearVariableArenaRef();
						lua_pop(L, 1);
						stack.upvalueVariables.push_back(var);
					}
					// pop function
					lua_pop(L, 1);
				}
			}

			level++;
		}

		// TODO
		lua_State *PL = manager->extension.QueryParentThread(L);

		if (PL != nullptr) {
			L = PL;
		} else {
			break;
		}
	}

	SetCurrentState(prevCurrentL);

	return false;
}